

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

domain_manager * __thiscall
cs::domain_manager::add_var_global<char_const(&)[9]>(domain_manager *this,char (*name) [9],var *var)

{
  bool bVar1;
  domain_type *this_00;
  runtime_error *this_01;
  allocator local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_88,*name,(allocator *)&local_68);
  bVar1 = var_exist_global(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (!bVar1) {
    this_00 = stack_type<cs::domain_type,_std::allocator>::bottom(&this->m_data);
    std::__cxx11::string::string((string *)&local_88,*name,(allocator *)&local_68);
    domain_type::add_var(this_00,&local_88,var);
    std::__cxx11::string::~string((string *)&local_88);
    return this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_48,*name,&local_89);
  std::operator+(&local_68,"Target domain exist variable \"",&local_48);
  std::operator+(&local_88,&local_68,"\".");
  runtime_error::runtime_error(this_01,&local_88);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

domain_manager &add_var_global(T &&name, const var &var)
		{
			if (var_exist_global(name))
				throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			else
				m_data.bottom().add_var(name, var);
			return *this;
		}